

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

LY_ERR ly_path_check_predicate
                 (ly_ctx *ctx,lysc_node *cur_node,lyxp_expr *exp,uint32_t *tok_idx,uint16_t prefix,
                 uint16_t pred)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  lyd_node *plVar4;
  LY_ERR LVar5;
  LY_ERR LVar6;
  int iVar7;
  char *pcVar8;
  lyxp_expr_type *plVar9;
  char *format;
  ulong uVar10;
  undefined6 in_register_00000082;
  char *pcVar11;
  ly_set *set;
  ly_set *local_40;
  uint local_38;
  uint local_34;
  
  local_38 = (uint)CONCAT62(in_register_00000082,prefix);
  local_40 = (ly_set *)0x0;
  if (cur_node != (lysc_node *)0x0) {
    ly_log_location(cur_node,(lyd_node *)0x0,(char *)0x0,(ly_in *)0x0);
  }
  LVar6 = LY_SUCCESS;
  LVar5 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_BRACK1);
  if (LVar5 == LY_SUCCESS) {
    if (pred == 0x100) {
LAB_00113538:
      LVar6 = lyxp_check_token((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_NAMETEST);
      if (LVar6 != LY_SUCCESS) {
        if (pred == 0x400) goto LAB_0011359f;
        if (pred != 0x200) goto LAB_001135ba;
        LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_DOT);
        if (LVar6 == LY_SUCCESS) {
          LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_OPER_EQUAL);
          if (LVar6 == LY_SUCCESS) {
            plVar9 = (lyxp_expr_type *)calloc(2,4);
            uVar2 = *tok_idx;
            exp->repeat[uVar2 - 2] = plVar9;
            if (exp->repeat[uVar2 - 2] == (lyxp_expr_type *)0x0) {
LAB_00113c2e:
              LVar6 = LY_EMEM;
              ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "ly_path_check_predicate");
              goto LAB_001134fa;
            }
            *exp->repeat[uVar2 - 2] = LYXP_EXPR_EQUALITY;
            LVar6 = lyxp_next_token2(ctx,exp,tok_idx,LYXP_TOKEN_LITERAL,LYXP_TOKEN_NUMBER);
            if (LVar6 == LY_SUCCESS) {
              LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_BRACK2);
              goto joined_r0x00113bdd;
            }
          }
        }
        else {
          LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_NUMBER);
          if (LVar6 != LY_SUCCESS) goto LAB_001135ba;
          uVar2 = *tok_idx;
          uVar1 = exp->tok_pos[uVar2 - 1];
          pcVar8 = exp->expr;
          iVar7 = atoi(pcVar8 + uVar1);
          if (iVar7 == 0) {
            ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Invalid positional predicate \"%.*s\".",
                    (ulong)exp->tok_len[uVar2 - 1],pcVar8 + uVar1);
          }
          else {
            LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_BRACK2);
joined_r0x00113bdd:
            if (LVar6 == LY_SUCCESS) {
              LVar6 = LY_SUCCESS;
              goto LAB_001134fa;
            }
          }
        }
        goto LAB_0011360e;
      }
      LVar6 = ly_set_new(&local_40);
      if (LVar6 == LY_SUCCESS) {
        local_34 = local_38 & 0xffff;
        do {
          LVar6 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_NAMETEST);
          if (LVar6 != LY_SUCCESS) goto LAB_0011360e;
          pcVar8 = strnstr(exp->expr + exp->tok_pos[*tok_idx],":",(ulong)exp->tok_len[*tok_idx]);
          if (((short)local_38 == 0x20) && (pcVar8 == (char *)0x0)) {
            uVar1 = exp->tok_len[*tok_idx];
            pcVar11 = exp->expr + exp->tok_pos[*tok_idx];
            pcVar8 = "Prefix missing for \"%.*s\" in path.";
LAB_00113cc4:
            ly_vlog(ctx,(char *)0x0,LYVE_XPATH,pcVar8,(ulong)uVar1,pcVar11);
            goto LAB_0011360e;
          }
          if ((local_34 == 0x80) && (pcVar8 != (char *)0x0)) {
            uVar1 = exp->tok_len[*tok_idx];
            pcVar11 = exp->expr + exp->tok_pos[*tok_idx];
            pcVar8 = "Redundant prefix for \"%.*s\" in path.";
            goto LAB_00113cc4;
          }
          uVar1 = *tok_idx;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = exp->expr + exp->tok_pos[uVar1];
            pcVar11 = (char *)(ulong)exp->tok_len[uVar1];
          }
          else {
            pcVar8 = pcVar8 + 1;
            pcVar11 = exp->expr +
                      ((ulong)exp->tok_len[uVar1] - (long)pcVar8) + (ulong)exp->tok_pos[uVar1];
          }
          if (local_40->count != 0) {
            uVar10 = 0;
            do {
              plVar4 = (local_40->field_2).dnodes[uVar10];
              iVar7 = strncmp((char *)plVar4,pcVar8,(size_t)pcVar11);
              if ((iVar7 == 0) &&
                 (LVar6 = lysp_check_identifierchar
                                    ((lysp_ctx *)0x0,(int)pcVar11[(long)&plVar4->hash],'\0',
                                     (uint8_t *)0x0), LVar6 != LY_SUCCESS)) goto LAB_00113b28;
              uVar10 = uVar10 + 1;
            } while (uVar10 < local_40->count);
          }
          LVar6 = ly_set_add(local_40,pcVar8,'\x01',(uint32_t *)0x0);
          if (LVar6 != LY_SUCCESS) break;
          *tok_idx = *tok_idx + 1;
          LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_OPER_EQUAL);
          if (LVar6 != LY_SUCCESS) goto LAB_0011360e;
          plVar9 = (lyxp_expr_type *)calloc(2,4);
          uVar2 = *tok_idx;
          exp->repeat[uVar2 - 2] = plVar9;
          if (exp->repeat[uVar2 - 2] == (lyxp_expr_type *)0x0) goto LAB_00113c2e;
          *exp->repeat[uVar2 - 2] = LYXP_EXPR_EQUALITY;
          LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_LITERAL);
          if (((LVar6 != LY_SUCCESS) &&
              (LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_NUMBER),
              LVar6 != LY_SUCCESS)) &&
             (LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_VARREF),
             LVar6 != LY_SUCCESS)) {
            lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_LITERAL);
            goto LAB_0011360e;
          }
          LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_BRACK2);
          if (LVar6 != LY_SUCCESS) goto LAB_0011360e;
          LVar6 = LY_SUCCESS;
          LVar5 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_BRACK1);
        } while (LVar5 == LY_SUCCESS);
      }
    }
    else {
      if (pred != 0x400) {
        if (pred == 0x200) goto LAB_00113538;
        goto LAB_001135ba;
      }
LAB_0011359f:
      LVar6 = lyxp_check_token((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_NAMETEST);
      if (LVar6 != LY_SUCCESS) {
LAB_001135ba:
        LVar6 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_NONE);
        if (LVar6 == LY_SUCCESS) {
          pcVar8 = lyxp_token2str(exp->tokens[*tok_idx]);
          ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath token \"%s\" (\"%.15s\").",pcVar8,
                  exp->expr + exp->tok_pos[*tok_idx]);
        }
LAB_0011360e:
        ly_log_location_revert((uint)(cur_node != (lysc_node *)0x0),0,0,0);
        LVar6 = LY_EVALID;
        goto LAB_00113628;
      }
      if ((short)local_38 != 0x10) {
        __assert_fail("prefix == LY_PATH_PREFIX_OPTIONAL",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                      ,0xa5,
                      "LY_ERR ly_path_check_predicate(const struct ly_ctx *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, uint16_t, uint16_t)"
                     );
      }
      LVar6 = ly_set_new(&local_40);
      LVar5 = LVar6;
      while (LVar5 == LY_SUCCESS) {
        LVar6 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_NAMETEST);
        if (LVar6 != LY_SUCCESS) goto LAB_0011360e;
        pcVar8 = strnstr(exp->expr + exp->tok_pos[*tok_idx],":",(ulong)exp->tok_len[*tok_idx]);
        uVar1 = *tok_idx;
        if (pcVar8 == (char *)0x0) {
          pcVar8 = exp->expr + exp->tok_pos[uVar1];
          pcVar11 = (char *)(ulong)exp->tok_len[uVar1];
        }
        else {
          pcVar8 = pcVar8 + 1;
          pcVar11 = exp->expr +
                    ((ulong)exp->tok_len[uVar1] - (long)pcVar8) + (ulong)exp->tok_pos[uVar1];
        }
        if (local_40->count != 0) {
          uVar10 = 0;
          do {
            plVar4 = (local_40->field_2).dnodes[uVar10];
            iVar7 = strncmp((char *)plVar4,pcVar8,(size_t)pcVar11);
            if ((iVar7 == 0) &&
               (LVar6 = lysp_check_identifierchar
                                  ((lysp_ctx *)0x0,(int)pcVar11[(long)&plVar4->hash],'\0',
                                   (uint8_t *)0x0), LVar6 != LY_SUCCESS)) goto LAB_00113b28;
            uVar10 = uVar10 + 1;
          } while (uVar10 < local_40->count);
        }
        LVar6 = ly_set_add(local_40,pcVar8,'\x01',(uint32_t *)0x0);
        if (LVar6 != LY_SUCCESS) break;
        *tok_idx = *tok_idx + 1;
        LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_OPER_EQUAL);
        if (LVar6 != LY_SUCCESS) goto LAB_0011360e;
        plVar9 = (lyxp_expr_type *)calloc(2,4);
        uVar2 = *tok_idx;
        exp->repeat[uVar2 - 2] = plVar9;
        if (exp->repeat[uVar2 - 2] == (lyxp_expr_type *)0x0) goto LAB_00113c2e;
        *exp->repeat[uVar2 - 2] = LYXP_EXPR_EQUALITY;
        LVar6 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_FUNCNAME);
        if (LVar6 != LY_SUCCESS) goto LAB_0011360e;
        uVar1 = *tok_idx;
        uVar3 = exp->tok_len[uVar1];
        if ((uVar3 != 7) ||
           (iVar7 = strncmp(exp->expr + exp->tok_pos[uVar1],"current",7), iVar7 != 0)) {
          pcVar8 = exp->expr + exp->tok_pos[uVar1];
          format = "Invalid function \"%.*s\" invocation in path.";
          uVar10 = (ulong)uVar3;
          goto LAB_00113b41;
        }
        *tok_idx = uVar1 + 1;
        LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_PAR1);
        if ((((LVar6 != LY_SUCCESS) ||
             (LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_PAR2), LVar6 != LY_SUCCESS)) ||
            (LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_OPER_PATH), LVar6 != LY_SUCCESS)) ||
           (LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_DDOT), LVar6 != LY_SUCCESS))
        goto LAB_0011360e;
        do {
          LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_OPER_PATH);
          if (LVar6 != LY_SUCCESS) goto LAB_0011360e;
          LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_DDOT);
        } while (LVar6 == LY_SUCCESS);
        do {
          LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_NAMETEST);
          if (LVar6 != LY_SUCCESS) goto LAB_0011360e;
          LVar6 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_OPER_PATH);
        } while (LVar6 == LY_SUCCESS);
        LVar6 = lyxp_next_token(ctx,exp,tok_idx,LYXP_TOKEN_BRACK2);
        if (LVar6 != LY_SUCCESS) goto LAB_0011360e;
        LVar6 = LY_SUCCESS;
        LVar5 = lyxp_next_token((ly_ctx *)0x0,exp,tok_idx,LYXP_TOKEN_BRACK1);
      }
    }
  }
LAB_001134fa:
  ly_log_location_revert((uint)(cur_node != (lysc_node *)0x0),0,0,0);
LAB_00113628:
  ly_set_free(local_40,(_func_void_void_ptr *)0x0);
  return LVar6;
LAB_00113b28:
  format = "Duplicate predicate key \"%.*s\" in path.";
  uVar10 = (ulong)pcVar11 & 0xffffffff;
LAB_00113b41:
  ly_vlog(ctx,(char *)0x0,LYVE_XPATH,format,uVar10,pcVar8);
  goto LAB_0011360e;
}

Assistant:

static LY_ERR
ly_path_check_predicate(const struct ly_ctx *ctx, const struct lysc_node *cur_node, const struct lyxp_expr *exp,
        uint32_t *tok_idx, uint16_t prefix, uint16_t pred)
{
    LY_ERR ret = LY_SUCCESS;
    struct ly_set *set = NULL;
    uint32_t i;
    const char *name;
    size_t name_len;

    if (cur_node) {
        LOG_LOCSET(cur_node, NULL);
    }

    if (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_BRACK1)) {
        /* '[' */

        if (((pred == LY_PATH_PRED_SIMPLE) || (pred == LY_PATH_PRED_KEYS)) &&
                !lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_NAMETEST)) {
            ret = ly_set_new(&set);
            LY_CHECK_GOTO(ret, cleanup);

            do {
                /* NameTest is always expected here */
                LY_CHECK_GOTO(lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_NAMETEST), token_error);

                /* check prefix based on the options */
                name = strnstr(exp->expr + exp->tok_pos[*tok_idx], ":", exp->tok_len[*tok_idx]);
                if ((prefix == LY_PATH_PREFIX_MANDATORY) && !name) {
                    LOGVAL(ctx, LYVE_XPATH, "Prefix missing for \"%.*s\" in path.", (int)exp->tok_len[*tok_idx],
                            exp->expr + exp->tok_pos[*tok_idx]);
                    goto token_error;
                } else if ((prefix == LY_PATH_PREFIX_STRICT_INHERIT) && name) {
                    LOGVAL(ctx, LYVE_XPATH, "Redundant prefix for \"%.*s\" in path.", (int)exp->tok_len[*tok_idx],
                            exp->expr + exp->tok_pos[*tok_idx]);
                    goto token_error;
                }
                if (!name) {
                    name = exp->expr + exp->tok_pos[*tok_idx];
                    name_len = exp->tok_len[*tok_idx];
                } else {
                    ++name;
                    name_len = exp->tok_len[*tok_idx] - (name - (exp->expr + exp->tok_pos[*tok_idx]));
                }

                /* check whether it was not already specified */
                for (i = 0; i < set->count; ++i) {
                    /* all the keys must be from the same module so this comparison should be fine */
                    if (!strncmp(set->objs[i], name, name_len) &&
                            lysp_check_identifierchar(NULL, ((char *)set->objs[i])[name_len], 0, NULL)) {
                        LOGVAL(ctx, LYVE_XPATH, "Duplicate predicate key \"%.*s\" in path.", (int)name_len, name);
                        goto token_error;
                    }
                }

                /* add it into the set */
                ret = ly_set_add(set, (void *)name, 1, NULL);
                LY_CHECK_GOTO(ret, cleanup);

                /* NameTest */
                ++(*tok_idx);

                /* '=' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_EQUAL), token_error);

                /* fill repeat */
                exp->repeat[*tok_idx - 2] = calloc(2, sizeof *exp->repeat[*tok_idx]);
                LY_CHECK_ERR_GOTO(!exp->repeat[*tok_idx - 2], LOGMEM(NULL); ret = LY_EMEM, cleanup);
                exp->repeat[*tok_idx - 2][0] = LYXP_EXPR_EQUALITY;

                /* Literal, Number, or VariableReference */
                if (lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_LITERAL) &&
                        lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_NUMBER) &&
                        lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_VARREF)) {
                    /* error */
                    lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_LITERAL);
                    goto token_error;
                }

                /* ']' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

                /* '[' */
            } while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_BRACK1));

        } else if ((pred == LY_PATH_PRED_SIMPLE) && !lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_DOT)) {
            /* '.' */

            /* '=' */
            LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_EQUAL), token_error);

            /* fill repeat */
            exp->repeat[*tok_idx - 2] = calloc(2, sizeof *exp->repeat[*tok_idx]);
            LY_CHECK_ERR_GOTO(!exp->repeat[*tok_idx - 2], LOGMEM(NULL); ret = LY_EMEM, cleanup);
            exp->repeat[*tok_idx - 2][0] = LYXP_EXPR_EQUALITY;

            /* Literal or Number */
            LY_CHECK_GOTO(lyxp_next_token2(ctx, exp, tok_idx, LYXP_TOKEN_LITERAL, LYXP_TOKEN_NUMBER), token_error);

            /* ']' */
            LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

        } else if ((pred == LY_PATH_PRED_SIMPLE) && !lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_NUMBER)) {
            /* Number */

            /* check for index 0 */
            if (!atoi(exp->expr + exp->tok_pos[*tok_idx - 1])) {
                LOGVAL(ctx, LYVE_XPATH, "Invalid positional predicate \"%.*s\".", (int)exp->tok_len[*tok_idx - 1],
                        exp->expr + exp->tok_pos[*tok_idx - 1]);
                goto token_error;
            }

            /* ']' */
            LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

        } else if ((pred == LY_PATH_PRED_LEAFREF) && !lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_NAMETEST)) {
            assert(prefix == LY_PATH_PREFIX_OPTIONAL);
            ret = ly_set_new(&set);
            LY_CHECK_GOTO(ret, cleanup);

            do {
                /* NameTest is always expected here */
                LY_CHECK_GOTO(lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_NAMETEST), token_error);

                name = strnstr(exp->expr + exp->tok_pos[*tok_idx], ":", exp->tok_len[*tok_idx]);
                if (!name) {
                    name = exp->expr + exp->tok_pos[*tok_idx];
                    name_len = exp->tok_len[*tok_idx];
                } else {
                    ++name;
                    name_len = exp->tok_len[*tok_idx] - (name - (exp->expr + exp->tok_pos[*tok_idx]));
                }

                /* check whether it was not already specified */
                for (i = 0; i < set->count; ++i) {
                    /* all the keys must be from the same module so this comparison should be fine */
                    if (!strncmp(set->objs[i], name, name_len) &&
                            lysp_check_identifierchar(NULL, ((char *)set->objs[i])[name_len], 0, NULL)) {
                        LOGVAL(ctx, LYVE_XPATH, "Duplicate predicate key \"%.*s\" in path.", (int)name_len, name);
                        goto token_error;
                    }
                }

                /* add it into the set */
                ret = ly_set_add(set, (void *)name, 1, NULL);
                LY_CHECK_GOTO(ret, cleanup);

                /* NameTest */
                ++(*tok_idx);

                /* '=' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_EQUAL), token_error);

                /* fill repeat */
                exp->repeat[*tok_idx - 2] = calloc(2, sizeof *exp->repeat[*tok_idx]);
                LY_CHECK_ERR_GOTO(!exp->repeat[*tok_idx - 2], LOGMEM(NULL); ret = LY_EMEM, cleanup);
                exp->repeat[*tok_idx - 2][0] = LYXP_EXPR_EQUALITY;

                /* FuncName */
                LY_CHECK_GOTO(lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_FUNCNAME), token_error);
                if ((exp->tok_len[*tok_idx] != ly_strlen_const("current")) ||
                        strncmp(exp->expr + exp->tok_pos[*tok_idx], "current", ly_strlen_const("current"))) {
                    LOGVAL(ctx, LYVE_XPATH, "Invalid function \"%.*s\" invocation in path.",
                            (int)exp->tok_len[*tok_idx], exp->expr + exp->tok_pos[*tok_idx]);
                    goto token_error;
                }
                ++(*tok_idx);

                /* '(' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_PAR1), token_error);

                /* ')' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_PAR2), token_error);

                /* '/' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_PATH), token_error);

                /* '..' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_DDOT), token_error);
                do {
                    /* '/' */
                    LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_OPER_PATH), token_error);
                } while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_DDOT));

                /* NameTest */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_NAMETEST), token_error);

                /* '/' */
                while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_OPER_PATH)) {
                    /* NameTest */
                    LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_NAMETEST), token_error);
                }

                /* ']' */
                LY_CHECK_GOTO(lyxp_next_token(ctx, exp, tok_idx, LYXP_TOKEN_BRACK2), token_error);

                /* '[' */
            } while (!lyxp_next_token(NULL, exp, tok_idx, LYXP_TOKEN_BRACK1));

        } else if (lyxp_check_token(ctx, exp, *tok_idx, 0)) {
            /* unexpected EOF */
            goto token_error;
        } else {
            /* invalid token */
            LOGVAL(ctx, LY_VCODE_XP_INTOK, lyxp_token2str(exp->tokens[*tok_idx]), exp->expr + exp->tok_pos[*tok_idx]);
            goto token_error;
        }
    }

cleanup:
    LOG_LOCBACK(cur_node ? 1 : 0, 0);
    ly_set_free(set, NULL);
    return ret;

token_error:
    LOG_LOCBACK(cur_node ? 1 : 0, 0);
    ly_set_free(set, NULL);
    return LY_EVALID;
}